

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

char * __thiscall Fl_Text_Buffer::line_text(Fl_Text_Buffer *this,int pos)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int local_30;
  int local_2c;
  
  local_2c = pos;
  iVar1 = findchar_backward(this,pos,10,&local_2c);
  iVar4 = local_2c;
  local_30 = pos;
  iVar2 = findchar_forward(this,pos,10,&local_30);
  if (iVar2 == 0) {
    local_30 = this->mLength;
  }
  iVar4 = iVar4 + 1;
  if (iVar1 == 0) {
    iVar4 = 0;
  }
  pcVar3 = text_range(this,iVar4,local_30);
  return pcVar3;
}

Assistant:

char *Fl_Text_Buffer::line_text(int pos) const {
  return text_range(line_start(pos), line_end(pos));
}